

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall AActor::SetOrigin(AActor *this,double x,double y,double z,bool moving)

{
  double dVar1;
  double dVar2;
  undefined7 in_register_00000031;
  int iVar3;
  
  UnlinkFromWorld(this);
  (this->__Pos).Z = z;
  (this->__Pos).Y = y;
  (this->__Pos).X = x;
  iVar3 = 0;
  LinkToWorld(this,false,(sector_t *)0x0);
  P_FindFloorCeiling(this,1);
  if ((int)CONCAT71(in_register_00000031,moving) == 0) {
    dVar1 = (this->__Pos).X;
    dVar2 = (this->__Pos).Y;
    (this->Prev).Z = (this->__Pos).Z;
    (this->Prev).X = dVar1;
    (this->Prev).Y = dVar2;
    (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
    dVar1 = (this->Angles).Yaw.Degrees;
    (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
    (this->PrevAngles).Yaw.Degrees = dVar1;
    if (this->Sector != (sector_t *)0x0) {
      iVar3 = this->Sector->PortalGroup;
    }
    this->PrevPortalGroup = iVar3;
  }
  return;
}

Assistant:

void AActor::SetOrigin(double x, double y, double z, bool moving)
{
	UnlinkFromWorld ();
	SetXYZ(x, y, z);
	LinkToWorld ();
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS);
	if (!moving) ClearInterpolation();
}